

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O2

void __thiscall cmCTestRunTest::StartFailure(cmCTestRunTest *this,string *output,string *detail)

{
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *local_1c0 [4];
  ostringstream cmCTestLog_msg;
  long alStack_190 [45];
  
  bVar2 = cmCTest::GetTestProgressOutput(this->CTest);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    iVar3 = getNumWidth(this->TotalNumberOfTests);
    *(long *)((long)alStack_190 + *(long *)(_cmCTestLog_msg + -0x18)) = (long)(iVar3 * 2 + 8);
    poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"Start ");
    iVar3 = getNumWidth((long)this->TestHandler->MaxIndex);
    *(long *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = (long)iVar3;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->TestProperties->Index);
    poVar4 = std::operator<<(poVar4,": ");
    poVar4 = std::operator<<(poVar4,(string *)this->TestProperties);
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x1c6,local_1c0[0],false);
    std::__cxx11::string::~string((string *)local_1c0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  (this->ProcessOutput)._M_string_length = 0;
  *(this->ProcessOutput)._M_dataplus._M_p = '\0';
  if (output->_M_string_length != 0) {
    poVar4 = std::operator<<(this->TestHandler->LogFile,(string *)output);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)output);
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x1cc,local_1c0[0],false);
    std::__cxx11::string::~string((string *)local_1c0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  (this->TestResult).Properties = this->TestProperties;
  (this->TestResult).ExecutionTime.__r = 0.0;
  (this->TestResult).CompressOutput = false;
  (this->TestResult).ReturnValue = -1;
  std::__cxx11::string::_M_assign((string *)&(this->TestResult).CompletionStatus);
  (this->TestResult).Status = 0;
  (this->TestResult).TestCount = this->TestProperties->Index;
  std::__cxx11::string::_M_assign((string *)&this->TestResult);
  std::__cxx11::string::_M_assign((string *)&(this->TestResult).Path);
  std::__cxx11::string::_M_assign((string *)&(this->TestResult).Output);
  (this->TestResult).FullCommandLine._M_string_length = 0;
  *(this->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
  (this->TestResult).Environment._M_string_length = 0;
  *(this->TestResult).Environment._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void cmCTestRunTest::StartFailure(std::string const& output,
                                  std::string const& detail)
{
  // Still need to log the Start message so the test summary records our
  // attempt to start this test
  if (!this->CTest->GetTestProgressOutput()) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               std::setw(2 * getNumWidth(this->TotalNumberOfTests) + 8)
                 << "Start "
                 << std::setw(getNumWidth(this->TestHandler->GetMaxIndex()))
                 << this->TestProperties->Index << ": "
                 << this->TestProperties->Name << std::endl);
  }

  this->ProcessOutput.clear();
  if (!output.empty()) {
    *this->TestHandler->LogFile << output << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE, output << std::endl);
  }

  this->TestResult.Properties = this->TestProperties;
  this->TestResult.ExecutionTime = cmDuration::zero();
  this->TestResult.CompressOutput = false;
  this->TestResult.ReturnValue = -1;
  this->TestResult.CompletionStatus = detail;
  this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
  this->TestResult.TestCount = this->TestProperties->Index;
  this->TestResult.Name = this->TestProperties->Name;
  this->TestResult.Path = this->TestProperties->Directory;
  this->TestResult.Output = output;
  this->TestResult.FullCommandLine.clear();
  this->TestResult.Environment.clear();
}